

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O2

bool __thiscall GenCADFile::parse_components(GenCADFile *this)

{
  uint *puVar1;
  bool bVar2;
  bool mirror_y;
  bool flip;
  bool bVar3;
  int lb;
  GenCADFile *pGVar4;
  char *pcVar5;
  mpc_ast_t *pmVar6;
  mpc_ast_t *pmVar7;
  GenCADFile *pGVar8;
  size_t sVar9;
  BRDPartMountingSide BVar10;
  string *psVar11;
  char local_8a [2];
  double local_88;
  BRDPart brd_part;
  
  fill_signals_cache(this);
  lb = 0;
  do {
    do {
      psVar11 = &brd_part.mfgcode;
      if (lb < 0) {
        return true;
      }
      lb = mpc_ast_get_index_lb(this->components_ast,"component|>",lb);
    } while (lb < 0);
    pGVar8 = (GenCADFile *)this->components_ast;
    pGVar4 = (GenCADFile *)mpc_ast_get_child_lb((mpc_ast_t *)pGVar8,"component|>",lb);
    brd_part.name = (char *)0x0;
    brd_part.mfgcode._M_dataplus._M_p = (pointer)&brd_part.mfgcode.field_2;
    brd_part.mfgcode._M_string_length = 0;
    brd_part.mfgcode.field_2._M_local_buf[0] = '\0';
    brd_part.p1.y = 0;
    brd_part.p2.x = 0;
    brd_part.p2.y = 0;
    brd_part.mounting_side = Both;
    brd_part.part_type = SMD;
    brd_part.end_of_pins = 0;
    brd_part.p1.x = 0;
    pcVar5 = get_nonquoted_or_quoted_string_child(pGVar8,(mpc_ast_t *)pGVar4,"component_name");
    if (pcVar5 != (char *)0x0) {
      brd_part.name = pcVar5;
    }
    pmVar6 = mpc_ast_get_child((mpc_ast_t *)pGVar4,"place|>");
    if (pmVar6 != (mpc_ast_t *)0x0) {
      pmVar6 = mpc_ast_get_child(pmVar6,"x_y_ref|>");
      if (pmVar6 != (mpc_ast_t *)0x0) {
        x_y_ref_to_brd_point(this,pmVar6,&brd_part.p1);
        x_y_ref_to_brd_point(this,pmVar6,&brd_part.p2);
      }
    }
    pmVar6 = mpc_ast_get_child((mpc_ast_t *)pGVar4,"rotation|>");
    pmVar7 = mpc_ast_get_child(pmVar6,"rot|number|regex");
    local_88 = 0.0;
    if (pmVar7 != (mpc_ast_t *)0x0 && pmVar6 != (mpc_ast_t *)0x0) {
      local_88 = atof(pmVar7->contents);
    }
    pGVar8 = (GenCADFile *)mpc_ast_get_child((mpc_ast_t *)pGVar4,"named_layer|>");
    if (pGVar8 != (GenCADFile *)0x0) {
      pmVar6 = mpc_ast_get_child((mpc_ast_t *)pGVar8,"layer_name|nonquoted_string|regex");
      bVar2 = has_text_content(pGVar8,pmVar6,"TOP");
      BVar10 = Top;
      if (!bVar2) {
        bVar2 = has_text_content(pGVar8,pmVar6,"BOTTOM");
        BVar10 = Bottom;
        if (!bVar2) goto LAB_00136a92;
      }
      brd_part.mounting_side = BVar10;
    }
LAB_00136a92:
    pGVar8 = pGVar4;
    pmVar6 = mpc_ast_get_child((mpc_ast_t *)pGVar4,"device_|>");
    if (pmVar6 != (mpc_ast_t *)0x0) {
      pcVar5 = get_stringtoend_child(pGVar8,pmVar6,"device_name");
      sVar9 = strlen(pcVar5);
      local_8a[1] = 0x20;
      local_8a[0] = '_';
      std::replace<char*,char>(pcVar5,pcVar5 + sVar9,local_8a + 1,local_8a);
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::assign((char *)psVar11);
      }
    }
    pGVar8 = (GenCADFile *)mpc_ast_get_child((mpc_ast_t *)pGVar4,"shape_|>");
    if (pGVar8 != (GenCADFile *)0x0) {
      pcVar5 = get_nonquoted_or_quoted_string_child(pGVar4,(mpc_ast_t *)pGVar8,"shape_name");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        if (brd_part.mfgcode._M_string_length != 0) {
          std::__cxx11::string::append((char *)psVar11);
        }
        std::__cxx11::string::append((char *)psVar11);
        pmVar6 = get_shape_by_name(this,pcVar5);
        if (pmVar6 != (mpc_ast_t *)0x0) {
          pGVar4 = pGVar8;
          pmVar7 = mpc_ast_get_child((mpc_ast_t *)pGVar8,"mirror|string");
          bVar2 = has_text_content(pGVar4,pmVar7,"MIRRORX");
          mirror_y = has_text_content(pGVar4,pmVar7,"MIRRORY");
          pmVar7 = mpc_ast_get_child((mpc_ast_t *)pGVar8,"flip|string");
          flip = has_text_content(pGVar8,pmVar7,"FLIP");
          bVar3 = is_shape_smd(this,pmVar6);
          brd_part.part_type._0_1_ = !bVar3;
          brd_part.part_type._1_3_ = 0;
          parse_shape_pins_to_component(this,&brd_part,local_88,bVar2,mirror_y,flip,pmVar6);
          if (brd_part.part_type == ThroughHole) {
            brd_part.mounting_side = Both;
            brd_part.part_type = ThroughHole;
          }
          brd_part.end_of_pins = (this->super_BRDFileBase).num_pins - 1;
        }
      }
    }
    std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
              (&(this->super_BRDFileBase).parts,&brd_part);
    puVar1 = &(this->super_BRDFileBase).num_parts;
    *puVar1 = *puVar1 + 1;
    lb = lb + 1;
    std::__cxx11::string::~string((string *)&brd_part.mfgcode);
  } while( true );
}

Assistant:

bool GenCADFile::parse_components() {
	fill_signals_cache();
	for (int i = 0; i >= 0;) {
		i = mpc_ast_get_index_lb(components_ast, "component|>", i);
		if (i >= 0) {
			mpc_ast_t *component_ast = mpc_ast_get_child_lb(components_ast, "component|>", i);

			BRDPart brd_part;
			char *component_name = get_nonquoted_or_quoted_string_child(component_ast, "component_name");
			if (component_name) {
				brd_part.name = component_name;
			}

			mpc_ast_t *place_ast = mpc_ast_get_child(component_ast, "place|>");
			if (place_ast) {
				mpc_ast_t *pos_ast = mpc_ast_get_child(place_ast, "x_y_ref|>");
				if (pos_ast) {
					x_y_ref_to_brd_point(pos_ast, &brd_part.p1);
					x_y_ref_to_brd_point(pos_ast, &brd_part.p2);
				}
			}

			double component_rotation_angle = 0.0;
			mpc_ast_t *rotation_ast         = mpc_ast_get_child(component_ast, "rotation|>");
			mpc_ast_t *rotation_value_ast   = mpc_ast_get_child(rotation_ast, "rot|number|regex");
			if (rotation_ast && rotation_value_ast) {
				component_rotation_angle = atof(rotation_value_ast->contents);
			}

			mpc_ast_t *layer_ast = mpc_ast_get_child(component_ast, "named_layer|>");
			if (layer_ast) {
				mpc_ast_t *layer_index_ast = mpc_ast_get_child(layer_ast, "layer_name|nonquoted_string|regex");
				if (has_text_content(layer_index_ast, "TOP")) {
					brd_part.mounting_side = BRDPartMountingSide::Top;
				} else if (has_text_content(layer_index_ast, "BOTTOM")) {
					brd_part.mounting_side = BRDPartMountingSide::Bottom;
				}
			}

			mpc_ast_t *component_device_ast = mpc_ast_get_child(component_ast, "device_|>");
			if (component_device_ast) {
				char *dev_name = get_stringtoend_child(component_device_ast, "device_name");
				// workaround for RSI-TRANSLATOR CAMCAD bad COMPONENT -> DEVICE references
				std::replace(dev_name, dev_name + strlen(dev_name), ' ', '_');
				if (dev_name) brd_part.mfgcode = dev_name;
			}

			mpc_ast_t *shape_ref_ast = mpc_ast_get_child(component_ast, "shape_|>");
			if (shape_ref_ast) {
				char *shape_name_str = get_nonquoted_or_quoted_string_child(shape_ref_ast, "shape_name");
				if (shape_name_str && *shape_name_str) {
					if (!brd_part.mfgcode.empty()) {
						brd_part.mfgcode += " SHAPE ";
					}
					brd_part.mfgcode += shape_name_str;
					mpc_ast_t *shape_ast = get_shape_by_name(shape_name_str);
					if (shape_ast) {
						mpc_ast_t *mirror_ast = mpc_ast_get_child(shape_ref_ast, "mirror|string");
						bool mirror_x         = has_text_content(mirror_ast, "MIRRORX");
						bool mirror_y         = has_text_content(mirror_ast, "MIRRORY");
						mpc_ast_t *flip_ast   = mpc_ast_get_child(shape_ref_ast, "flip|string");
						bool flip             = has_text_content(flip_ast, "FLIP");
						brd_part.part_type    = is_shape_smd(shape_ast) ? BRDPartType::SMD : BRDPartType::ThroughHole;
						parse_shape_pins_to_component(&brd_part, component_rotation_angle, mirror_x, mirror_y, flip, shape_ast);
						if ( brd_part.part_type == BRDPartType::ThroughHole ) {
							brd_part.mounting_side = BRDPartMountingSide::Both;
						}
						brd_part.end_of_pins = num_pins - 1;
					}
				}
			}
			parts.push_back(brd_part);
			num_parts++;
			i++;
		}
	}
	return true;
}